

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall QCss::Parser::parseAttrib(Parser *this,AttributeSelector *attr)

{
  TokenType TVar1;
  long lVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  ValueMatchType VVar9;
  long lVar10;
  Symbol *pSVar11;
  long lVar12;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (this->symbols).d.size;
  iVar8 = this->index;
  lVar10 = (long)iVar8;
  if (lVar10 < lVar2) {
    pSVar11 = (this->symbols).d.ptr;
    if (pSVar11[lVar10].token == S) {
      pSVar11 = pSVar11 + lVar10;
      lVar6 = -1;
      do {
        lVar12 = lVar6;
        pSVar11 = pSVar11 + 1;
        if (lVar10 - lVar2 == lVar12) break;
        lVar6 = lVar12 + -1;
      } while (pSVar11->token == S);
      this->index = iVar8 - (int)lVar12;
      iVar8 = iVar8 - (int)lVar12;
    }
    lVar10 = (long)iVar8;
  }
  if (lVar10 < lVar2) {
    iVar8 = iVar8 + 1;
    this->index = iVar8;
    pSVar11 = (this->symbols).d.ptr;
    if (pSVar11[lVar10].token != IDENT) goto LAB_005e4414;
    Symbol::lexem(&local_38,pSVar11 + (long)iVar8 + -1);
    pQVar3 = &((attr->name).d.d)->super_QArrayData;
    pcVar4 = (attr->name).d.ptr;
    (attr->name).d.d = local_38.d.d;
    (attr->name).d.ptr = local_38.d.ptr;
    qVar5 = (attr->name).d.size;
    (attr->name).d.size = local_38.d.size;
    local_38.d.d = (Data *)pQVar3;
    local_38.d.ptr = pcVar4;
    local_38.d.size = qVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    lVar2 = (this->symbols).d.size;
    iVar8 = this->index;
    lVar10 = (long)iVar8;
    if (lVar10 < lVar2) {
      pSVar11 = (this->symbols).d.ptr;
      if (pSVar11[lVar10].token == S) {
        pSVar11 = pSVar11 + lVar10;
        lVar6 = -1;
        do {
          lVar12 = lVar6;
          pSVar11 = pSVar11 + 1;
          if (lVar10 - lVar2 == lVar12) break;
          lVar6 = lVar12 + -1;
        } while (pSVar11->token == S);
        this->index = iVar8 - (int)lVar12;
        iVar8 = iVar8 - (int)lVar12;
      }
      lVar10 = (long)iVar8;
    }
    if (lVar2 <= lVar10) goto LAB_005e4414;
    VVar9 = MatchEqual;
    if (((((this->symbols).d.ptr[lVar10].token != EQUAL) &&
         (VVar9 = MatchIncludes, (this->symbols).d.ptr[lVar10].token != INCLUDES)) &&
        (VVar9 = MatchDashMatch, (this->symbols).d.ptr[lVar10].token != DASHMATCH)) &&
       ((VVar9 = MatchBeginsWith, (this->symbols).d.ptr[lVar10].token != BEGINSWITH &&
        (VVar9 = MatchEndsWith, (this->symbols).d.ptr[lVar10].token != ENDSWITH)))) {
      iVar8 = iVar8 + 1;
      TVar1 = (this->symbols).d.ptr[lVar10].token;
      this->index = iVar8;
      VVar9 = MatchContains;
      if (TVar1 == CONTAINS) goto LAB_005e42dd;
      TVar1 = (this->symbols).d.ptr[lVar10].token;
joined_r0x005e4455:
      bVar7 = true;
      if (TVar1 == RBRACKET) goto LAB_005e4419;
      goto LAB_005e4414;
    }
    this->index = iVar8 + 1;
LAB_005e42dd:
    attr->valueMatchCriterium = VVar9;
    iVar8 = this->index;
    lVar10 = (long)iVar8;
    if (lVar10 < lVar2) {
      pSVar11 = (this->symbols).d.ptr;
      if (pSVar11[lVar10].token == S) {
        pSVar11 = pSVar11 + lVar10;
        lVar6 = -1;
        do {
          lVar12 = lVar6;
          pSVar11 = pSVar11 + 1;
          if (lVar10 - lVar2 == lVar12) break;
          lVar6 = lVar12 + -1;
        } while (pSVar11->token == S);
        this->index = iVar8 - (int)lVar12;
        iVar8 = iVar8 - (int)lVar12;
      }
      lVar10 = (long)iVar8;
    }
    if ((lVar10 < lVar2) &&
       (((this->symbols).d.ptr[lVar10].token == IDENT ||
        ((this->symbols).d.ptr[lVar10].token == STRING)))) {
      this->index = iVar8 + 1;
      unquotedLexem(&local_38,this);
      pQVar3 = &((attr->value).d.d)->super_QArrayData;
      pcVar4 = (attr->value).d.ptr;
      (attr->value).d.d = local_38.d.d;
      (attr->value).d.ptr = local_38.d.ptr;
      qVar5 = (attr->value).d.size;
      (attr->value).d.size = local_38.d.size;
      local_38.d.d = (Data *)pQVar3;
      local_38.d.ptr = pcVar4;
      local_38.d.size = qVar5;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
      lVar2 = (this->symbols).d.size;
      iVar8 = this->index;
      lVar10 = (long)iVar8;
      if (lVar10 < lVar2) {
        pSVar11 = (this->symbols).d.ptr;
        if (pSVar11[lVar10].token == S) {
          pSVar11 = pSVar11 + lVar10;
          lVar6 = -1;
          do {
            lVar12 = lVar6;
            pSVar11 = pSVar11 + 1;
            if (lVar10 - lVar2 == lVar12) break;
            lVar6 = lVar12 + -1;
          } while (pSVar11->token == S);
          this->index = iVar8 - (int)lVar12;
          iVar8 = iVar8 - (int)lVar12;
        }
        lVar10 = (long)iVar8;
      }
      if (lVar2 <= lVar10) goto LAB_005e4414;
      iVar8 = iVar8 + 1;
      this->index = iVar8;
      TVar1 = (this->symbols).d.ptr[lVar10].token;
      goto joined_r0x005e4455;
    }
  }
  else {
LAB_005e4414:
    this->errorIndex = iVar8;
  }
  bVar7 = false;
LAB_005e4419:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseAttrib(AttributeSelector *attr)
{
    skipSpace();
    if (!next(IDENT)) return false;
    attr->name = lexem();
    skipSpace();

    if (test(EQUAL)) {
        attr->valueMatchCriterium = AttributeSelector::MatchEqual;
    } else if (test(INCLUDES)) {
        attr->valueMatchCriterium = AttributeSelector::MatchIncludes;
    } else if (test(DASHMATCH)) {
        attr->valueMatchCriterium = AttributeSelector::MatchDashMatch;
    } else if (test(BEGINSWITH)) {
        attr->valueMatchCriterium = AttributeSelector::MatchBeginsWith;
    } else if (test(ENDSWITH)) {
        attr->valueMatchCriterium = AttributeSelector::MatchEndsWith;
    } else if (test(CONTAINS)) {
        attr->valueMatchCriterium = AttributeSelector::MatchContains;
    } else {
        return next(RBRACKET);
    }

    skipSpace();

    if (!test(IDENT) && !test(STRING)) return false;
    attr->value = unquotedLexem();

    skipSpace();
    return next(RBRACKET);
}